

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_hub.cpp
# Opt level: O0

void G_ReadHubInfo(PNGHandle *png)

{
  FILE *file;
  undefined1 local_318 [8];
  FPNGChunkArchive arc;
  int chunklen;
  PNGHandle *png_local;
  
  arc.Chunk._52_4_ = M_FindPNGChunk(png,0x73427568);
  if (arc.Chunk._52_4_ != 0) {
    file = FileReader::GetFile(png->File);
    FPNGChunkArchive::FPNGChunkArchive
              ((FPNGChunkArchive *)local_318,file,0x73427568,(long)(int)arc.Chunk._52_4_);
    G_SerializeHub((FArchive *)local_318);
    FPNGChunkArchive::~FPNGChunkArchive((FPNGChunkArchive *)local_318);
  }
  return;
}

Assistant:

void G_ReadHubInfo (PNGHandle *png)
{
	int chunklen;

	if ((chunklen = M_FindPNGChunk (png, HUBS_ID)) != 0)
	{
		FPNGChunkArchive arc (png->File->GetFile(), HUBS_ID, chunklen);
		G_SerializeHub(arc);
	}
}